

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

node_t_conflict cond_expr(c2m_ctx_t c2m_ctx,int no_err_p)

{
  token_t ptVar1;
  pos_t p;
  node_t_conflict pnVar2;
  node_t_conflict pnVar3;
  node *pnVar4;
  
  pnVar2 = left_op(c2m_ctx,no_err_p,0x10b,-1,land_expr);
  pnVar4 = &err_struct;
  if ((pnVar2 != &err_struct) &&
     (ptVar1 = c2m_ctx->parse_ctx->curr_token, pnVar4 = pnVar2, *(short *)ptVar1 == 0x3f)) {
    p = ptVar1->pos;
    read_token(c2m_ctx);
    pnVar2 = new_pos_node1(c2m_ctx,N_COND,p,pnVar2);
    pnVar3 = right_op(c2m_ctx,no_err_p,0x2c,-1,assign_expr,expr);
    pnVar4 = &err_struct;
    if ((pnVar3 != &err_struct) &&
       (op_append(c2m_ctx,pnVar2,pnVar3), *(short *)c2m_ctx->parse_ctx->curr_token == 0x3a)) {
      read_token(c2m_ctx);
      pnVar3 = cond_expr(c2m_ctx,no_err_p);
      pnVar4 = &err_struct;
      if (pnVar3 != &err_struct) {
        op_append(c2m_ctx,pnVar2,pnVar3);
        pnVar4 = pnVar2;
      }
    }
  }
  return pnVar4;
}

Assistant:

D (cond_expr) {
  node_t r, n;
  pos_t pos;

  P (lor_expr);
  if (!MP ('?', pos)) return r;
  n = new_pos_node1 (c2m_ctx, N_COND, pos, r);
  P (expr);
  op_append (c2m_ctx, n, r);
  if (!M (':')) return err_node;
  P (cond_expr);
  op_append (c2m_ctx, n, r);
  return n;
}